

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall
CGameClient::EvolveCharacter(CGameClient *this,CNetObj_Character *pCharacter,int Tick)

{
  int iVar1;
  long in_FS_OFFSET;
  CCharacterCore TempCore;
  CCharacterCore CStack_328;
  CWorldCore local_2a8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2a8.m_Tuning.m_GroundControlSpeed.m_Value = 1000;
  local_2a8.m_Tuning.m_GroundControlAccel.m_Value = 200;
  local_2a8.m_Tuning.m_GroundFriction.m_Value = 0x32;
  local_2a8.m_Tuning.m_GroundJumpImpulse.m_Value = 0x528;
  local_2a8.m_Tuning.m_AirJumpImpulse.m_Value = 0x4b0;
  local_2a8.m_Tuning.m_AirControlSpeed.m_Value = 500;
  local_2a8.m_Tuning.m_AirControlAccel.m_Value = 0x96;
  local_2a8.m_Tuning.m_AirFriction.m_Value = 0x5f;
  local_2a8.m_Tuning.m_HookLength.m_Value = 38000;
  local_2a8.m_Tuning.m_HookFireSpeed.m_Value = 8000;
  local_2a8.m_Tuning.m_HookDragAccel.m_Value = 300;
  local_2a8.m_Tuning.m_HookDragSpeed.m_Value = 0x5dc;
  local_2a8.m_Tuning.m_Gravity.m_Value = 0x32;
  local_2a8.m_Tuning.m_VelrampStart.m_Value = 55000;
  local_2a8.m_Tuning.m_VelrampRange.m_Value = 200000;
  local_2a8.m_Tuning.m_VelrampCurvature.m_Value = 0x8c;
  local_2a8.m_Tuning.m_GunCurvature.m_Value = 0x7d;
  local_2a8.m_Tuning.m_GunSpeed.m_Value = 220000;
  local_2a8.m_Tuning.m_GunLifetime.m_Value = 200;
  local_2a8.m_Tuning.m_ShotgunCurvature.m_Value = 0x7d;
  local_2a8.m_Tuning.m_ShotgunSpeed.m_Value = 0x43238;
  local_2a8.m_Tuning.m_ShotgunSpeeddiff.m_Value = 0x50;
  local_2a8.m_Tuning.m_ShotgunLifetime.m_Value = 0x14;
  local_2a8.m_Tuning.m_GrenadeCurvature.m_Value = 700;
  local_2a8.m_Tuning.m_GrenadeSpeed.m_Value = 100000;
  local_2a8.m_Tuning.m_GrenadeLifetime.m_Value = 200;
  local_2a8.m_Tuning.m_LaserReach.m_Value = 80000;
  local_2a8.m_Tuning.m_LaserBounceDelay.m_Value = 15000;
  local_2a8.m_Tuning.m_LaserBounceNum.m_Value = 100;
  local_2a8.m_Tuning.m_LaserBounceCost.m_Value = 0;
  local_2a8.m_Tuning.m_PlayerCollision.m_Value = 100;
  local_2a8.m_Tuning.m_PlayerHooking.m_Value = 100;
  mem_zero(local_2a8.m_apCharacters,0x200);
  mem_zero(&CStack_328,0x80);
  CCharacterCore::Init(&CStack_328,&local_2a8,&this->m_Collision);
  CCharacterCore::Read(&CStack_328,&pCharacter->super_CNetObj_CharacterCore);
  iVar1 = (pCharacter->super_CNetObj_CharacterCore).m_Tick;
  while (iVar1 < Tick) {
    (pCharacter->super_CNetObj_CharacterCore).m_Tick = iVar1 + 1;
    CCharacterCore::Tick(&CStack_328,false);
    CCharacterCore::Move(&CStack_328);
    CCharacterCore::Quantize(&CStack_328);
    iVar1 = (pCharacter->super_CNetObj_CharacterCore).m_Tick;
  }
  CCharacterCore::Write(&CStack_328,&pCharacter->super_CNetObj_CharacterCore);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::EvolveCharacter(CNetObj_Character *pCharacter, int Tick)
{
	CWorldCore TempWorld;
	CCharacterCore TempCore;
	mem_zero(&TempCore, sizeof(TempCore));
	TempCore.Init(&TempWorld, Collision());
	TempCore.Read(pCharacter);

	while(pCharacter->m_Tick < Tick)
	{
		pCharacter->m_Tick++;
		TempCore.Tick(false);
		TempCore.Move();
		TempCore.Quantize();
	}

	TempCore.Write(pCharacter);
}